

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GB.cpp
# Opt level: O2

void __thiscall OpenMD::GB::addType(GB *this,AtomType *atomType)

{
  undefined8 *puVar1;
  size_t sVar2;
  long lVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  AtomType *this_00;
  _Base_ptr p_Var7;
  long lVar8;
  int iVar9;
  long lVar10;
  RealType RVar11;
  double dVar12;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined1 auVar13 [16];
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  pair<std::_Rb_tree_iterator<int>,_bool> pVar24;
  int atid;
  GayBerneAdapter gba2;
  GayBerneAdapter gba1;
  LennardJonesAdapter lja1;
  LennardJonesAdapter lja2;
  string DistanceMix;
  double local_208;
  double local_200;
  double local_1f8;
  double local_1f0;
  double local_1e8;
  double local_1e0;
  double local_1d8;
  uint local_1c4;
  RealType local_1c0;
  RealType local_1b8;
  RealType local_1b0;
  double local_1a8;
  locale local_1a0 [8];
  GayBerneAdapter local_198;
  double local_190;
  GayBerneAdapter local_188;
  LennardJonesAdapter local_180;
  RealType local_178;
  undefined8 uStack_170;
  long local_160;
  long local_158;
  size_t local_150;
  AtomType *local_148;
  _Rb_tree_node_base *local_140;
  double local_138;
  double local_130;
  double local_128;
  double local_120;
  double local_118;
  LennardJonesAdapter local_110;
  string local_108;
  double local_e8;
  undefined8 uStack_e0;
  double local_d8;
  double local_c8;
  double local_b8;
  double local_a8;
  double local_98;
  double local_88;
  double local_78;
  double local_68;
  double local_58;
  double local_48;
  
  local_1c4 = AtomType::getIdent(atomType);
  sVar2 = (this->GBtypes)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  pVar24 = std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
           _M_insert_unique<int_const&>
                     ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                      &this->GBtypes,(int *)&local_1c4);
  if (pVar24.second == false) {
    snprintf(painCave.errMsg,2000,"GB already had a previous entry with ident %d\n",(ulong)local_1c4
            );
    painCave.isFatal = 0;
    painCave.severity = 3;
    simError();
  }
  iVar9 = (int)sVar2;
  (this->GBtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start[(int)local_1c4] = iVar9;
  lVar10 = (long)iVar9;
  local_158 = lVar10 * 0x18;
  local_150 = sVar2;
  std::vector<OpenMD::GBInteractionData,_std::allocator<OpenMD::GBInteractionData>_>::resize
            ((this->MixingMap).
             super__Vector_base<std::vector<OpenMD::GBInteractionData,_std::allocator<OpenMD::GBInteractionData>_>,_std::allocator<std::vector<OpenMD::GBInteractionData,_std::allocator<OpenMD::GBInteractionData>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + lVar10,(long)this->nGB_);
  local_188.at_ = atomType;
  local_180.at_ = atomType;
  bVar4 = GayBerneAdapter::isGayBerne(&local_188);
  local_148 = atomType;
  if (bVar4) {
    local_1c0 = GayBerneAdapter::getD(&local_188);
    RVar11 = GayBerneAdapter::getL(&local_188);
    local_1b0 = GayBerneAdapter::getEpsX(&local_188);
    local_1f8 = GayBerneAdapter::getEpsS(&local_188);
    local_1f0 = GayBerneAdapter::getEpsE(&local_188);
    local_1b8 = GayBerneAdapter::getDw(&local_188);
  }
  else {
    bVar4 = LennardJonesAdapter::isLennardJones(&local_180);
    if (bVar4) {
      local_1c0 = LennardJonesAdapter::getSigma(&local_180);
      local_1c0 = local_1c0 / 1.4142135623730951;
      local_1f8 = LennardJonesAdapter::getEpsilon(&local_180);
      local_1b8 = 1.0;
      RVar11 = local_1c0;
      local_1f0 = local_1f8;
      local_1b0 = local_1f8;
    }
    else {
      AtomType::getName_abi_cxx11_(&local_108,atomType);
      snprintf(painCave.errMsg,2000,
               "GB::addType was passed an atomType (%s) that does not\n\tappear to be a Gay-Berne or Lennard-Jones atom.\n"
               ,local_108._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_108);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
      local_1c0 = 0.0;
      local_1b8 = 0.0;
      local_1f0 = 0.0;
      local_1f8 = 0.0;
      local_1b0 = 0.0;
      RVar11 = 0.0;
    }
  }
  p_Var7 = (this->GBtypes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_140 = &(this->GBtypes)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_190 = local_1c0 * local_1c0;
  local_e8 = RVar11 * RVar11 - local_190;
  uStack_e0 = 0;
  local_160 = lVar10 * 0x50;
  while( true ) {
    if (p_Var7 == local_140) break;
    iVar9 = (this->GBtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[(int)p_Var7[1]._M_color];
    lVar10 = (long)iVar9;
    this_00 = ForceField::getAtomType(this->forceField_,p_Var7[1]._M_color);
    local_198.at_ = this_00;
    local_110.at_ = this_00;
    bVar4 = GayBerneAdapter::isGayBerne(&local_198);
    if (bVar4) {
      local_1e0 = GayBerneAdapter::getD(&local_198);
      local_178 = GayBerneAdapter::getL(&local_198);
      uStack_170 = extraout_XMM0_Qb;
      local_208 = GayBerneAdapter::getEpsX(&local_198);
      local_200 = GayBerneAdapter::getEpsS(&local_198);
      local_1d8 = GayBerneAdapter::getEpsE(&local_198);
      local_1e8 = GayBerneAdapter::getDw(&local_198);
    }
    else {
      bVar4 = LennardJonesAdapter::isLennardJones(&local_110);
      if (bVar4) {
        local_178 = LennardJonesAdapter::getSigma(&local_110);
        local_178 = local_178 / 1.4142135623730951;
        uStack_170 = extraout_XMM0_Qb_00;
        local_208 = LennardJonesAdapter::getEpsilon(&local_110);
        local_1e8 = 1.0;
        local_200 = local_208;
        local_1e0 = local_178;
        local_1d8 = local_208;
      }
      else {
        AtomType::getName_abi_cxx11_(&local_108,this_00);
        snprintf(painCave.errMsg,2000,
                 "GB::addType found an atomType (%s) that does not\n\tappear to be a Gay-Berne or Lennard-Jones atom.\n"
                 ,local_108._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&local_108);
        painCave.isFatal = 1;
        painCave.severity = 1;
        simError();
        local_1e8 = 0.0;
        local_1d8 = 0.0;
        local_178 = 0.0;
        uStack_170 = 0;
        local_208 = local_1d8;
        local_200 = local_1d8;
        local_1e0 = local_178;
      }
    }
    std::__cxx11::string::string
              ((string *)&local_108,
               (string *)&(this->forceField_->forceFieldOptions_).DistanceMixingRule.data_);
    std::locale::locale(local_1a0);
    toUpper<std::__cxx11::string>(&local_108,local_1a0);
    std::locale::~locale(local_1a0);
    bVar4 = std::operator==(&local_108,"ARITHMETIC");
    local_118 = local_1e0 * local_1e0;
    if (bVar4) {
      dVar14 = (local_1e0 + local_1c0) * 0.5;
    }
    else {
      dVar14 = SQRT(local_190 + local_118);
    }
    dVar17 = (local_1e8 + local_1b8) * 0.5;
    local_208 = local_208 * local_1b0;
    if (local_208 < 0.0) {
      local_1a8 = sqrt(local_208);
    }
    else {
      local_1a8 = SQRT(local_208);
    }
    dVar15 = 1.0 / this->mu_;
    local_58 = pow(local_1f8,dVar15);
    local_68 = pow(local_1f0,dVar15);
    local_78 = pow(local_1f8,dVar15);
    local_88 = pow(local_1d8,dVar15);
    local_48 = pow(local_200,dVar15);
    local_98 = pow(local_1d8,dVar15);
    local_a8 = pow(local_200,dVar15);
    local_b8 = pow(local_1f0,dVar15);
    local_120 = pow(local_1f8,dVar15);
    local_128 = pow(local_1f0,dVar15);
    local_c8 = pow(local_200,dVar15);
    local_130 = pow(local_1d8,dVar15);
    dVar12 = pow(local_200,dVar15);
    local_138 = pow(local_1f0,dVar15);
    local_d8 = pow(local_1f8,dVar15);
    dVar15 = pow(local_1d8,dVar15);
    bVar4 = AtomType::isLennardJones(local_148);
    bVar5 = AtomType::isLennardJones(this_00);
    bVar6 = GayBerneAdapter::isGayBerne(&local_188);
    if ((bVar6) || (bVar6 = GayBerneAdapter::isGayBerne(&local_198), bVar6)) {
      std::vector<OpenMD::GBInteractionData,_std::allocator<OpenMD::GBInteractionData>_>::resize
                ((this->MixingMap).
                 super__Vector_base<std::vector<OpenMD::GBInteractionData,_std::allocator<OpenMD::GBInteractionData>_>,_std::allocator<std::vector<OpenMD::GBInteractionData,_std::allocator<OpenMD::GBInteractionData>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + lVar10,(long)this->nGB_);
      dVar16 = RVar11 * RVar11 + local_118;
      dVar18 = local_178 * local_178 - local_118;
      auVar13._0_8_ = local_e8 * dVar18;
      auVar13._8_8_ = dVar18;
      dVar18 = local_178 * local_178 + local_190;
      auVar19._0_8_ = dVar18 * dVar16;
      auVar19._8_8_ = dVar18;
      auVar13 = divpd(auVar13,auVar19);
      auVar22._0_8_ = local_48 - local_98;
      auVar22._8_8_ = local_58 - local_68;
      auVar23._8_8_ = local_88 + local_78;
      auVar23._0_8_ = local_b8 + local_a8;
      auVar23 = divpd(auVar22,auVar23);
      auVar20._8_8_ = ((local_c8 - local_130) * (local_120 - local_128)) / (dVar12 + local_138);
      auVar20._0_8_ = local_e8;
      auVar21._8_8_ = local_d8 + dVar15;
      auVar21._0_8_ = dVar16;
      auVar21 = divpd(auVar20,auVar21);
      lVar3 = *(long *)((long)&(((this->MixingMap).
                                 super__Vector_base<std::vector<OpenMD::GBInteractionData,_std::allocator<OpenMD::GBInteractionData>_>,_std::allocator<std::vector<OpenMD::GBInteractionData,_std::allocator<OpenMD::GBInteractionData>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super__Vector_base<OpenMD::GBInteractionData,_std::allocator<OpenMD::GBInteractionData>_>
                               )._M_impl.super__Vector_impl_data + local_158);
      lVar8 = lVar10 * 0x50;
      *(double *)(lVar3 + lVar8) = dVar14;
      *(double *)(lVar3 + 8 + lVar8) = local_1a8;
      *(double *)(lVar3 + 0x10 + lVar8) = dVar17;
      *(long *)(lVar3 + 0x18 + lVar8) = auVar13._0_8_;
      puVar1 = (undefined8 *)(lVar3 + 0x20 + lVar8);
      *puVar1 = auVar21._0_8_;
      puVar1[1] = auVar13._8_8_;
      puVar1 = (undefined8 *)(lVar3 + 0x30 + lVar8);
      *puVar1 = auVar21._8_8_;
      puVar1[1] = auVar23._8_8_;
      *(long *)(lVar3 + 0x40 + lVar8) = auVar23._0_8_;
      *(bool *)(lVar3 + 0x48 + lVar8) = bVar4;
      *(bool *)(lVar3 + 0x49 + lVar8) = bVar5;
      if (iVar9 != (int)local_150) {
        lVar10 = *(long *)&(this->MixingMap).
                           super__Vector_base<std::vector<OpenMD::GBInteractionData,_std::allocator<OpenMD::GBInteractionData>_>,_std::allocator<std::vector<OpenMD::GBInteractionData,_std::allocator<OpenMD::GBInteractionData>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[lVar10].
                           super__Vector_base<OpenMD::GBInteractionData,_std::allocator<OpenMD::GBInteractionData>_>
                           ._M_impl.super__Vector_impl_data;
        *(double *)(lVar10 + local_160) = dVar14;
        *(double *)(lVar10 + 8 + local_160) = local_1a8;
        *(double *)(lVar10 + 0x10 + local_160) = dVar17;
        *(undefined1 (*) [16])(lVar10 + 0x18 + local_160) = auVar13;
        *(undefined1 (*) [16])(lVar10 + 0x28 + local_160) = auVar21;
        *(undefined1 (*) [16])(lVar10 + 0x38 + local_160) = auVar23;
        *(bool *)(lVar10 + 0x48 + local_160) = bVar5;
        *(bool *)(lVar10 + 0x49 + local_160) = bVar4;
      }
    }
    std::__cxx11::string::~string((string *)&local_108);
    p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
  }
  return;
}

Assistant:

void GB::addType(AtomType* atomType) {
    // add it to the map:
    int atid  = atomType->getIdent();
    int gbtid = GBtypes.size();

    pair<set<int>::iterator, bool> ret;
    ret = GBtypes.insert(atid);
    if (ret.second == false) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "GB already had a previous entry with ident %d\n", atid);
      painCave.severity = OPENMD_INFO;
      painCave.isFatal  = 0;
      simError();
    }

    GBtids[atid] = gbtid;
    MixingMap[gbtid].resize(nGB_);

    RealType d1(0.0), l1(0.0), eX1(0.0), eS1(0.0), eE1(0.0), dw1(0.0);

    LennardJonesAdapter lja1 = LennardJonesAdapter(atomType);
    GayBerneAdapter gba1     = GayBerneAdapter(atomType);
    if (gba1.isGayBerne()) {
      d1  = gba1.getD();
      l1  = gba1.getL();
      eX1 = gba1.getEpsX();
      eS1 = gba1.getEpsS();
      eE1 = gba1.getEpsE();
      dw1 = gba1.getDw();
    } else if (lja1.isLennardJones()) {
      d1  = lja1.getSigma() / sqrt(2.0);
      l1  = d1;
      eX1 = lja1.getEpsilon();
      eS1 = eX1;
      eE1 = eX1;
      dw1 = 1.0;
    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "GB::addType was passed an atomType (%s) that does not\n"
               "\tappear to be a Gay-Berne or Lennard-Jones atom.\n",
               atomType->getName().c_str());
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }

    // Now, iterate over all known types and add to the mixing map:

    std::set<int>::iterator it;
    for (it = GBtypes.begin(); it != GBtypes.end(); ++it) {
      int gbtid2       = GBtids[(*it)];
      AtomType* atype2 = forceField_->getAtomType((*it));

      LennardJonesAdapter lja2 = LennardJonesAdapter(atype2);
      GayBerneAdapter gba2     = GayBerneAdapter(atype2);
      RealType d2(0.0), l2(0.0), eX2(0.0), eS2(0.0), eE2(0.0), dw2(0.0);

      if (gba2.isGayBerne()) {
        d2  = gba2.getD();
        l2  = gba2.getL();
        eX2 = gba2.getEpsX();
        eS2 = gba2.getEpsS();
        eE2 = gba2.getEpsE();
        dw2 = gba2.getDw();
      } else if (lja2.isLennardJones()) {
        d2  = lja2.getSigma() / sqrt(2.0);
        l2  = d2;
        eX2 = lja2.getEpsilon();
        eS2 = eX2;
        eE2 = eX2;
        dw2 = 1.0;
      } else {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "GB::addType found an atomType (%s) that does not\n"
                 "\tappear to be a Gay-Berne or Lennard-Jones atom.\n",
                 atype2->getName().c_str());
        painCave.severity = OPENMD_ERROR;
        painCave.isFatal  = 1;
        simError();
      }

      GBInteractionData mixer1, mixer2;

      //  Cleaver paper uses sqrt of squares to get sigma0 for
      //  mixed interactions.
      ForceFieldOptions& fopts = forceField_->getForceFieldOptions();
      string DistanceMix       = fopts.getDistanceMixingRule();
      toUpper(DistanceMix);

      if (DistanceMix == "ARITHMETIC")
        mixer1.sigma0 = 0.5 * (d1 + d2);
      else
        mixer1.sigma0 = sqrt(d1 * d1 + d2 * d2);

      mixer1.xa2  = (l1 * l1 - d1 * d1) / (l1 * l1 + d2 * d2);
      mixer1.xai2 = (l2 * l2 - d2 * d2) / (l2 * l2 + d1 * d1);
      mixer1.x2   = (l1 * l1 - d1 * d1) * (l2 * l2 - d2 * d2) /
                  ((l2 * l2 + d1 * d1) * (l1 * l1 + d2 * d2));

      mixer2.sigma0 = mixer1.sigma0;
      // xa2 and xai2 for j-i pairs are reversed from the same i-j pairing.
      // Swapping the particles reverses the anisotropy parameters:
      mixer2.xa2  = mixer1.xai2;
      mixer2.xai2 = mixer1.xa2;
      mixer2.x2   = mixer1.x2;

      // assumed LB mixing rules for now:

      mixer1.dw   = 0.5 * (dw1 + dw2);
      mixer1.eps0 = sqrt(eX1 * eX2);

      mixer2.dw   = mixer1.dw;
      mixer2.eps0 = mixer1.eps0;

      RealType mi = RealType(1.0) / mu_;

      mixer1.xpap2 =
          (pow(eS1, mi) - pow(eE1, mi)) / (pow(eS1, mi) + pow(eE2, mi));
      mixer1.xpapi2 =
          (pow(eS2, mi) - pow(eE2, mi)) / (pow(eS2, mi) + pow(eE1, mi));
      mixer1.xp2 =
          (pow(eS1, mi) - pow(eE1, mi)) * (pow(eS2, mi) - pow(eE2, mi)) /
          (pow(eS2, mi) + pow(eE1, mi)) / (pow(eS1, mi) + pow(eE2, mi));

      // xpap2 and xpapi2 for j-i pairs are reversed from the same i-j pairing.
      // Swapping the particles reverses the anisotropy parameters:
      mixer2.xpap2  = mixer1.xpapi2;
      mixer2.xpapi2 = mixer1.xpap2;
      mixer2.xp2    = mixer1.xp2;
      // keep track of who is the LJ atom:
      mixer1.i_is_LJ = atomType->isLennardJones();
      mixer1.j_is_LJ = atype2->isLennardJones();
      mixer2.i_is_LJ = mixer1.j_is_LJ;
      mixer2.j_is_LJ = mixer1.i_is_LJ;

      // only add this pairing if at least one of the atoms is a Gay-Berne atom

      if (gba1.isGayBerne() || gba2.isGayBerne()) {
        MixingMap[gbtid2].resize(nGB_);
        MixingMap[gbtid][gbtid2] = mixer1;
        if (gbtid2 != gbtid) { MixingMap[gbtid2][gbtid] = mixer2; }
      }
    }
  }